

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O2

void __thiscall D2xNvmFlash::writeOptions(D2xNvmFlash *this)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar5;
  bool bVar6;
  const_reference cVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __last1;
  _Bit_iterator __first2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> userRow;
  vector<bool,_std::allocator<bool>_> current;
  
  userRow._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  iVar8 = (*(this->super_Flash)._vptr_Flash[0x13])();
  if (((char)iVar8 != '\0') && ((this->super_Flash)._bor._dirty == true)) {
    bVar6 = (this->super_Flash)._bor._value;
    iVar8 = (*(this->super_Flash)._vptr_Flash[0x11])(this);
    if (bVar6 != (bool)(char)iVar8) {
      readUserRow(this,&userRow);
      bVar12 = 7;
      if ((this->super_Flash)._bor._value == false) {
        bVar12 = 0;
      }
      *(byte *)((long)userRow._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1) =
           bVar12 | *(byte *)((long)userRow._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1)
                    & 0xf8;
    }
  }
  iVar8 = (*(this->super_Flash)._vptr_Flash[0x10])(this);
  if (((char)iVar8 != '\0') && ((this->super_Flash)._bod._dirty == true)) {
    bVar6 = (this->super_Flash)._bod._value;
    iVar8 = (*(this->super_Flash)._vptr_Flash[0xe])(this);
    if (bVar6 != (bool)(char)iVar8) {
      readUserRow(this,&userRow);
      bVar12 = 0;
      if ((this->super_Flash)._bod._value != false) {
        bVar12 = 6;
      }
      *(byte *)((long)userRow._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1) =
           bVar12 | *(byte *)((long)userRow._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1)
                    & 0xf9;
    }
  }
  if ((this->super_Flash)._regions._dirty == true) {
    (*(this->super_Flash)._vptr_Flash[10])(&current);
    p_Var4 = &(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl
    ;
    uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last1.super__Bit_iterator_base._M_offset = uVar3;
    __last1.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar6 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_iterator>
                      (__first1,__last1,__first2);
    if (!bVar6) {
      readUserRow(this,&userRow);
      uVar5 = userRow;
      for (uVar10 = 0;
          (ulong)uVar10 <
          (ulong)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
          uVar10 = uVar10 + 1) {
        cVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&(this->super_Flash)._regions._value,(ulong)uVar10);
        bVar12 = *(byte *)((long)uVar5._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 6 +
                          (ulong)(uVar10 >> 3));
        bVar14 = (byte)(1 << ((byte)uVar10 & 7));
        bVar13 = ~bVar14 & bVar12;
        if (!cVar7) {
          bVar13 = bVar12 | bVar14;
        }
        *(byte *)((long)uVar5._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 6 +
                 (ulong)(uVar10 >> 3)) = bVar13;
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&current.super__Bvector_base<std::allocator<bool>_>);
  }
  if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
      userRow._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    uVar9 = readReg(this,'\x04');
    writeReg(this,'\x04',uVar9 | 0x40080);
    writeReg(this,'\x1c',0x402000);
    command(this,'\x05');
    this_00 = &(this->super_Flash)._wordCopy;
    uVar10 = (this->super_Flash)._size;
    for (uVar11 = 0; uVar11 < uVar10 * 4; uVar11 = uVar11 + uVar10) {
      (*(this->super_Flash)._vptr_Flash[0x1b])
                (this,(ulong)uVar11 +
                      (long)userRow._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                 (ulong)(uVar10 & 0xffff));
      command(this,'D');
      WordCopyApplet::setDstAddr(this_00,uVar11 + 0x804000);
      WordCopyApplet::setSrcAddr
                (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
      pbVar1 = &(this->super_Flash)._onBufferA;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
      waitReady(this);
      Applet::runv(&this_00->super_Applet);
      writeReg(this,'\x1c',uVar11 + 0x804000 >> 1);
      command(this,'\x06');
      uVar10 = (this->super_Flash)._size;
    }
  }
  if (((this->super_Flash)._security._dirty == true) &&
     ((this->super_Flash)._security._value == true)) {
    iVar8 = (*(this->super_Flash)._vptr_Flash[0xc])(this);
    if ((char)iVar8 != '\x01') {
      command(this,'E');
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&userRow);
  return;
}

Assistant:

void
D2xNvmFlash::writeOptions()
{
    std::unique_ptr<uint8_t[]> userRow;

    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        readUserRow(userRow);
        if (_bor.get())
            userRow[NVM_UR_BOD33_RESET_OFFSET] |= NVM_UR_BOD33_RESET_MASK;
        else
            userRow[NVM_UR_BOD33_RESET_OFFSET] &= ~NVM_UR_BOD33_RESET_MASK;
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        readUserRow(userRow);
        if (_bod.get())
            userRow[NVM_UR_BOD33_ENABLE_OFFSET] |= NVM_UR_BOD33_ENABLE_MASK;
        else
            userRow[NVM_UR_BOD33_ENABLE_OFFSET] &= ~NVM_UR_BOD33_ENABLE_MASK;
    }
    if (_regions.isDirty())
    {
        // Check if any lock bits are different from the current set
        std::vector<bool> current = getLockRegions();
        if (!equal(_regions.get().begin(), _regions.get().end(), current.begin()))
        {
            readUserRow(userRow);

            uint8_t* lockBits = &userRow[NVM_UR_NVM_LOCK_OFFSET];
            for (uint32_t region = 0; region < _regions.get().size(); region++)
            {
                if (_regions.get()[region])
                    lockBits[region / 8] &= ~(1 << (region % 8));
                else
                    lockBits[region / 8] |= (1 << (region % 8));
            }
        }
    }

    // Erase and write the user row if modified
    if (userRow)
    {
        // Disable cache and configure manual page write
        writeReg(NVM_REG_CTRLB, readReg(NVM_REG_CTRLB) | (0x1 << 18) | (0x1 << 7));

        // Erase user row
        writeReg(NVM_REG_ADDR, NVM_UR_ADDR / 2);
        command(NVM_CMD_EAR);

        // Write user row in page chunks
        for (uint32_t offset = 0; offset < NVM_UR_SIZE; offset += _size)
        {
            // Load the buffer with the page
            loadBuffer(&userRow[offset], _size);

            // Clear page buffer
            command(NVM_CMD_PBC);

            // Copy page to page buffer
            _wordCopy.setDstAddr(NVM_UR_ADDR + offset);
            _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
            _onBufferA = !_onBufferA;
            waitReady();
            _wordCopy.runv();

            // Write the page
            writeReg(NVM_REG_ADDR, (NVM_UR_ADDR + offset) / 2);
            command(NVM_CMD_WAP);
        }
    }

    // Always do security last
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        command(NVM_CMD_SSB);
    }
}